

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double betapdf(double x,double a,double b)

{
  double dVar1;
  double local_38;
  double lb;
  double la;
  double oup;
  double b_local;
  double a_local;
  double x_local;
  
  if ((x < 0.0) || (1.0 < x)) {
    printf("x only accepts real values between 0.0 and 1.0");
    exit(1);
  }
  if ((0.0 <= a) && (0.0 <= b)) {
    if (((a == 1.0) && (!NAN(a))) || ((x == 0.0 && (!NAN(x))))) {
      lb = 0.0;
    }
    else {
      dVar1 = log(x);
      lb = (a - 1.0) * dVar1;
    }
    if (((b == 1.0) && (!NAN(b))) || ((x == 1.0 && (!NAN(x))))) {
      local_38 = 0.0;
    }
    else {
      local_38 = log(1.0 - x);
      local_38 = (b - 1.0) * local_38;
    }
    dVar1 = beta_log(a,b);
    dVar1 = exp((lb + local_38) - dVar1);
    return dVar1;
  }
  printf(" The Two Inputs should be nonnegative and real");
  exit(1);
}

Assistant:

double betapdf(double x, double a , double b) {
	double oup,la,lb;
	/*
	 * The pdf of Beta distribution function is given by
	 * x^(a-1) * (1-x)^(b-1) / B(a,b)
	 * 
	 * or
	 * 
	 * exp((a-1)*log(x) + (b-1)*log(1-x) - beta_log(a,b))
	 * 
	 * Ref 26.1.33 Abramowitz and Stegun
	 */ 
	 
	if (x < 0. || x > 1.) {
		printf("x only accepts real values between 0.0 and 1.0");
		exit(1);
	}
	if (a < 0. || b < 0.) {
		printf(" The Two Inputs should be nonnegative and real");
		exit(1);
	} 
	
	if (a == 1. || x == 0.) {
		la = 0.;
	} else {
		la = (a - 1.) * log(x);
	}
	
	if (b == 1. || x == 1.) {
		lb = 0.;
	} else {
		lb = (b - 1.) * log(1. - x);
	}
	
	oup = exp(la + lb - beta_log(a,b));
	
	return oup;
}